

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vpgen_clip_polygon.cpp
# Opt level: O0

void __thiscall agg::vpgen_clip_polygon::move_to(vpgen_clip_polygon *this,double x,double y)

{
  uint uVar1;
  double y_local;
  double x_local;
  vpgen_clip_polygon *this_local;
  
  *(undefined4 *)(this + 0x7c) = 0;
  *(undefined4 *)(this + 0x78) = 0;
  uVar1 = clipping_flags(this,x,y);
  *(uint *)(this + 0x30) = uVar1;
  if (*(int *)(this + 0x30) == 0) {
    *(double *)(this + 0x38) = x;
    *(double *)(this + 0x58) = y;
    *(undefined4 *)(this + 0x78) = 1;
  }
  *(double *)(this + 0x20) = x;
  *(double *)(this + 0x28) = y;
  *(undefined4 *)(this + 0x80) = 1;
  return;
}

Assistant:

void vpgen_clip_polygon::move_to(double x, double y)
    {
        m_vertex = 0;
        m_num_vertices = 0;
        m_clip_flags = clipping_flags(x, y);
        if(m_clip_flags == 0)
        {
            m_x[0] = x;
            m_y[0] = y;
            m_num_vertices = 1;
        }
        m_x1  = x;
        m_y1  = y;
        m_cmd = path_cmd_move_to;
    }